

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::Interpreter(Interpreter *this,ifstream *s)

{
  map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  mapped_type *pmVar3;
  
  this_00 = &this->operations;
  p_Var1 = &(this->operations)._M_t._M_impl.super__Rb_tree_header;
  (this->operations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->operations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->operations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->operations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->operations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->currentOp = 0;
  this->stackPos = 0;
  (this->callList).super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->callList).super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->callList).super__Vector_base<Interpreter::Call,_std::allocator<Interpreter::Call>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->s = s;
  pvVar2 = malloc(0x1000);
  this->stack = pvVar2;
  pvVar2 = malloc(0x1000);
  this->res = pvVar2;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::POP);
  *pmVar3 = (mapped_type)pop;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::PUSH);
  *pmVar3 = (mapped_type)push;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::ADD);
  *pmVar3 = (mapped_type)add;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::SUB);
  *pmVar3 = (mapped_type)sub;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::MUL);
  *pmVar3 = (mapped_type)mul;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::DIV);
  *pmVar3 = (mapped_type)div;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::PRINT);
  *pmVar3 = (mapped_type)print;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::LESS);
  *pmVar3 = (mapped_type)less;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::LESS_EQUAL);
  *pmVar3 = (mapped_type)less_equal;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::EQUAL);
  *pmVar3 = (mapped_type)equal;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::GREATER_EQUAL);
  *pmVar3 = (mapped_type)greater_equal;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::GREATER);
  *pmVar3 = (mapped_type)greater;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::GOTO);
  *pmVar3 = (mapped_type)_goto;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::IF);
  *pmVar3 = (mapped_type)_if;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::INCR);
  *pmVar3 = (mapped_type)incr;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::DECR);
  *pmVar3 = (mapped_type)decr;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::MOV);
  *pmVar3 = (mapped_type)mov;
  pmVar3[1] = 0;
  pmVar3 = std::
           map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
           ::operator[](this_00,&op::ASSIGN);
  *pmVar3 = (mapped_type)assign;
  pmVar3[1] = 0;
  return;
}

Assistant:

Interpreter::Interpreter(std::ifstream &s) {
    this->s = &s;
    stack = malloc(STACK_SIZE);
    res = malloc(RES_SIZE);

    operations[op::POP] = &Interpreter::pop;
    operations[op::PUSH] = &Interpreter::push;
    operations[op::ADD] = (void (Interpreter::*)(void *)) &Interpreter::add;
    operations[op::SUB] = (void (Interpreter::*)(void *)) &Interpreter::sub;
    operations[op::MUL] = (void (Interpreter::*)(void *)) &Interpreter::mul;
    operations[op::DIV] = (void (Interpreter::*)(void *)) &Interpreter::div;
    operations[op::PRINT] = (void (Interpreter::*)(void *)) &Interpreter::print;
    operations[op::LESS] = (void (Interpreter::*)(void *)) &Interpreter::less;
    operations[op::LESS_EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::less_equal;
    operations[op::EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::equal;
    operations[op::GREATER_EQUAL] = (void (Interpreter::*)(void *)) &Interpreter::greater_equal;
    operations[op::GREATER] = (void (Interpreter::*)(void *)) &Interpreter::greater;
    operations[op::GOTO] = &Interpreter::_goto;
    operations[op::IF] = (void (Interpreter::*)(void *)) &Interpreter::_if;
    operations[op::INCR] = (void (Interpreter::*)(void *)) &Interpreter::incr;
    operations[op::DECR] = (void (Interpreter::*)(void *)) &Interpreter::decr;
    operations[op::MOV] = &Interpreter::mov;
//    operations[op::VAR] = &Interpreter::var;
    operations[op::ASSIGN] = &Interpreter::assign;
}